

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O3

void __thiscall sysapi::epoll_registration::swap(epoll_registration *this,epoll_registration *other)

{
  int iVar1;
  uint32_t uVar2;
  epoll *peVar3;
  _Manager_type p_Var4;
  _Invoker_type p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Any_data __tmp;
  
  peVar3 = this->ep;
  this->ep = other->ep;
  other->ep = peVar3;
  iVar1 = this->fd;
  this->fd = other->fd;
  other->fd = iVar1;
  uVar2 = this->events;
  this->events = other->events;
  other->events = uVar2;
  uVar6 = *(undefined8 *)&(this->callback).super__Function_base._M_functor;
  uVar7 = *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8);
  uVar8 = *(undefined8 *)((long)&(other->callback).super__Function_base._M_functor + 8);
  *(undefined8 *)&(this->callback).super__Function_base._M_functor =
       *(undefined8 *)&(other->callback).super__Function_base._M_functor;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = uVar8;
  *(undefined8 *)&(other->callback).super__Function_base._M_functor = uVar6;
  *(undefined8 *)((long)&(other->callback).super__Function_base._M_functor + 8) = uVar7;
  p_Var4 = (this->callback).super__Function_base._M_manager;
  (this->callback).super__Function_base._M_manager =
       (other->callback).super__Function_base._M_manager;
  (other->callback).super__Function_base._M_manager = p_Var4;
  p_Var5 = (this->callback)._M_invoker;
  (this->callback)._M_invoker = (other->callback)._M_invoker;
  (other->callback)._M_invoker = p_Var5;
  if (this->ep != (epoll *)0x0) {
    epoll::modify(this->ep,this->fd,this->events,this);
  }
  if (other->ep != (epoll *)0x0) {
    epoll::modify(other->ep,other->fd,other->events,other);
    return;
  }
  return;
}

Assistant:

void epoll_registration::swap(epoll_registration& other)
{
    std::swap(ep,       other.ep);
    std::swap(fd,       other.fd);
    std::swap(events,   other.events);
    std::swap(callback, other.callback);
    update();
    other.update();
}